

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int getregion(region *rp)

{
  line *plVar1;
  line *plVar2;
  line *plVar3;
  line *plVar4;
  mgwin *pmVar5;
  int iVar6;
  char *fmt;
  int iVar7;
  line *plVar8;
  line *plVar9;
  
  plVar1 = curwp->w_markp;
  if (plVar1 == (line *)0x0) {
    dobeep();
    fmt = "No mark set in this window";
LAB_001161cc:
    iVar6 = 0;
    ewprintf(fmt);
  }
  else {
    plVar2 = curwp->w_dotp;
    if (plVar2 == plVar1) {
      rp->r_linep = plVar2;
      pmVar5 = curwp;
      rp->r_lineno = curwp->w_dotline;
      iVar6 = pmVar5->w_doto;
      iVar7 = pmVar5->w_marko;
      if (iVar6 < iVar7) {
        rp->r_offset = iVar6;
        rp->r_size = iVar7 - iVar6;
      }
      else {
        rp->r_offset = iVar7;
        rp->r_size = iVar6 - iVar7;
      }
    }
    else {
      iVar6 = curwp->w_doto;
      iVar7 = (plVar2->l_used - iVar6) + 1;
      plVar3 = curbp->b_headp;
      plVar8 = plVar2;
      plVar9 = plVar2;
      do {
        do {
          plVar4 = plVar9->l_fp;
          if (plVar4 == plVar3) {
            if (plVar8->l_bp == plVar3) {
              dobeep();
              fmt = "Bug: lost mark";
              goto LAB_001161cc;
            }
            if (plVar4 != plVar3) goto LAB_00116121;
          }
          else {
LAB_00116121:
            if (plVar4 == plVar1) {
              rp->r_linep = plVar2;
              pmVar5 = curwp;
              rp->r_offset = curwp->w_doto;
              rp->r_lineno = pmVar5->w_dotline;
              rp->r_size = iVar7 + pmVar5->w_marko;
              goto LAB_001161b9;
            }
            iVar7 = iVar7 + plVar4->l_used + 1;
            plVar9 = plVar4;
          }
          plVar4 = plVar8->l_bp;
        } while (plVar4 == plVar3);
        iVar6 = iVar6 + plVar4->l_used + 1;
        plVar8 = plVar4;
      } while (plVar4 != plVar1);
      rp->r_linep = plVar4;
      pmVar5 = curwp;
      iVar7 = curwp->w_marko;
      rp->r_offset = iVar7;
      rp->r_lineno = pmVar5->w_markline;
      rp->r_size = iVar6 - iVar7;
    }
LAB_001161b9:
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int
getregion(struct region *rp)
{
	struct line	*flp, *blp;
	long	 fsize, bsize;

	if (curwp->w_markp == NULL) {
		dobeep();
		ewprintf("No mark set in this window");
		return (FALSE);
	}

	/* "r_size" always ok */
	if (curwp->w_dotp == curwp->w_markp) {
		rp->r_linep = curwp->w_dotp;
		rp->r_lineno = curwp->w_dotline;
		if (curwp->w_doto < curwp->w_marko) {
			rp->r_offset = curwp->w_doto;
			rp->r_size = (RSIZE)(curwp->w_marko - curwp->w_doto);
		} else {
			rp->r_offset = curwp->w_marko;
			rp->r_size = (RSIZE)(curwp->w_doto - curwp->w_marko);
		}
		return (TRUE);
	}
	/* get region size */
	flp = blp = curwp->w_dotp;
	bsize = curwp->w_doto;
	fsize = llength(flp) - curwp->w_doto + 1;
	while (lforw(flp) != curbp->b_headp || lback(blp) != curbp->b_headp) {
		if (lforw(flp) != curbp->b_headp) {
			flp = lforw(flp);
			if (flp == curwp->w_markp) {
				rp->r_linep = curwp->w_dotp;
				rp->r_offset = curwp->w_doto;
				rp->r_lineno = curwp->w_dotline;
				return (setsize(rp,
				    (RSIZE)(fsize + curwp->w_marko)));
			}
			fsize += llength(flp) + 1;
		}
		if (lback(blp) != curbp->b_headp) {
			blp = lback(blp);
			bsize += llength(blp) + 1;
			if (blp == curwp->w_markp) {
				rp->r_linep = blp;
				rp->r_offset = curwp->w_marko;
				rp->r_lineno = curwp->w_markline;
				return (setsize(rp,
				    (RSIZE)(bsize - curwp->w_marko)));
			}
		}
	}
	dobeep();
	ewprintf("Bug: lost mark");
	return (FALSE);
}